

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_free.c
# Opt level: O2

void lysc_ident_free(lysf_ctx *ctx,lysc_ident *ident)

{
  lysc_ext_instance *plVar1;
  void *pvVar2;
  long lVar3;
  
  lydict_remove(ctx->ctx,ident->name);
  lydict_remove(ctx->ctx,ident->dsc);
  lydict_remove(ctx->ctx,ident->ref);
  if (ident->derived != (lysc_ident **)0x0) {
    free(ident->derived + -1);
  }
  lVar3 = 0;
  pvVar2 = (void *)0x0;
  while( true ) {
    plVar1 = ident->exts;
    if (plVar1 == (lysc_ext_instance *)0x0) {
      return;
    }
    if (plVar1[-1].compiled <= pvVar2) break;
    lysc_ext_instance_free(ctx,(lysc_ext_instance *)((long)&plVar1->def + lVar3));
    pvVar2 = (void *)((long)pvVar2 + 1);
    lVar3 = lVar3 + 0x48;
  }
  free(&plVar1[-1].compiled);
  return;
}

Assistant:

static void
lysc_ident_free(struct lysf_ctx *ctx, struct lysc_ident *ident)
{
    lydict_remove(ctx->ctx, ident->name);
    lydict_remove(ctx->ctx, ident->dsc);
    lydict_remove(ctx->ctx, ident->ref);
    LY_ARRAY_FREE(ident->derived);
    FREE_ARRAY(ctx, ident->exts, lysc_ext_instance_free);
}